

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_sse
               (Mat *kernel,Mat *kernel_tm2,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  int *piVar12;
  char cVar13;
  int i;
  int iVar14;
  long lVar15;
  long lVar16;
  undefined4 *puVar17;
  ulong uVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  undefined4 *puVar22;
  uint uVar23;
  void *pvVar24;
  undefined8 *puVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  void *pvVar30;
  undefined4 *puVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float tmp [6] [3];
  Mat local_c8;
  void *local_80;
  float fStack_78;
  undefined8 auStack_74 [8];
  
  uVar27 = (ulong)(uint)outch;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,0x24,inch,outch,4,(Allocator *)0x0);
  uVar18 = (ulong)(uint)inch;
  if (0 < outch) {
    local_80 = kernel->data;
    uVar21 = 0;
    pvVar30 = local_c8.data;
    do {
      if (0 < inch) {
        iVar14 = inch * 9 * (int)uVar21;
        uVar28 = 0;
        pvVar19 = pvVar30;
        do {
          fVar1 = *(float *)((long)local_80 + uVar28 * 0x24 + (long)iVar14 * 4 + 0x18);
          fVar2 = *(float *)((long)local_80 + uVar28 * 0x24 + (long)iVar14 * 4 + 0x1c);
          fVar3 = *(float *)((long)local_80 + uVar28 * 0x24 + (long)iVar14 * 4 + 0x20);
          auVar8 = vinsertps_avx(ZEXT416(*(uint *)((long)local_80 + uVar28 * 0x24 + (long)iVar14 * 4
                                                  )),
                                 ZEXT416(*(uint *)((long)local_80 +
                                                  uVar28 * 0x24 + (long)iVar14 * 4 + 0x10)),0x10);
          auVar32 = vinsertps_avx(ZEXT416(*(uint *)((long)local_80 +
                                                   uVar28 * 0x24 + (long)iVar14 * 4 + 0xc)),
                                  ZEXT416(*(uint *)((long)local_80 +
                                                   uVar28 * 0x24 + (long)iVar14 * 4 + 4)),0x10);
          auVar9 = vinsertps_avx(ZEXT416(*(uint *)((long)local_80 +
                                                  uVar28 * 0x24 + (long)iVar14 * 4 + 8)),
                                 ZEXT416(*(uint *)((long)local_80 +
                                                  uVar28 * 0x24 + (long)iVar14 * 4 + 0x14)),0x10);
          lVar16 = 8;
          do {
            uVar20 = *(ulong *)((long)&DAT_005197d8 + lVar16);
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar20;
            fVar10 = (float)uVar20;
            auVar34._0_4_ = auVar32._0_4_ * fVar10;
            fVar11 = (float)(uVar20 >> 0x20);
            auVar34._4_4_ = auVar32._4_4_ * fVar11;
            auVar34._8_4_ = auVar32._8_4_ * 0.0;
            auVar34._12_4_ = auVar32._12_4_ * 0.0;
            auVar34 = vshufps_avx(auVar34,auVar34,0xe1);
            fVar4 = *(float *)((long)&DAT_005197e0 + lVar16);
            auVar35._0_4_ = auVar8._0_4_ * fVar10 + fVar4 * auVar9._0_4_ + auVar34._0_4_;
            auVar35._4_4_ = auVar8._4_4_ * fVar11 + fVar4 * auVar9._4_4_ + auVar34._4_4_;
            auVar35._8_4_ = auVar8._8_4_ * 0.0 + fVar4 * auVar9._8_4_ + auVar34._8_4_;
            auVar35._12_4_ = auVar8._12_4_ * 0.0 + fVar4 * auVar9._12_4_ + auVar34._12_4_;
            uVar5 = vmovlps_avx(auVar35);
            *(undefined8 *)((long)&local_80 + lVar16) = uVar5;
            auVar34 = vmovshdup_avx(auVar33);
            *(float *)((long)auStack_74 + lVar16 + -4) =
                 fVar2 * auVar34._0_4_ + fVar4 * fVar3 + fVar1 * fVar10;
            lVar16 = lVar16 + 0xc;
          } while (lVar16 != 0x50);
          lVar16 = 0;
          pvVar24 = pvVar19;
          do {
            fVar1 = *(float *)((long)auStack_74 + lVar16 * 0xc + -4);
            uVar5 = *(undefined8 *)((long)auStack_74 + lVar16 * 0xc);
            puVar25 = (undefined8 *)((long)&DAT_005197e0 + 4);
            lVar15 = 0;
            do {
              auVar32._0_4_ = (float)*puVar25 * (float)uVar5;
              auVar32._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar5 >> 0x20);
              auVar32._8_8_ = 0;
              auVar8 = vmovshdup_avx(auVar32);
              *(float *)((long)pvVar24 + lVar15 * 4) =
                   auVar32._0_4_ + fVar1 * *(float *)((long)puVar25 + -4) + auVar8._0_4_;
              lVar15 = lVar15 + 1;
              puVar25 = (undefined8 *)((long)puVar25 + 0xc);
            } while (lVar15 != 6);
            lVar16 = lVar16 + 1;
            pvVar24 = (void *)((long)pvVar24 + 0x18);
          } while (lVar16 != 6);
          uVar28 = uVar28 + 1;
          pvVar19 = (void *)((long)pvVar19 +
                            (long)local_c8.w *
                            CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        } while (uVar28 != uVar18);
      }
      uVar21 = uVar21 + 1;
      pvVar30 = (void *)((long)pvVar30 +
                        local_c8.cstep *
                        CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
    } while (uVar21 != uVar27);
  }
  uVar23 = outch + 3;
  iVar14 = outch + 7;
  if (-1 < outch) {
    uVar23 = outch;
    iVar14 = outch;
  }
  cVar13 = (char)outch - ((byte)iVar14 & 0xf8);
  uVar21 = 0;
  Mat::create(kernel_tm2,inch * 8,0x24,
              (outch - (uVar23 & 0xfffffffc)) + (iVar14 >> 3) +
              (int)((char)(((byte)(cVar13 >> 7) >> 6) + cVar13) >> 2),4,(Allocator *)0x0);
  if (7 < outch) {
    iVar14 = kernel_tm2->w;
    pvVar30 = kernel_tm2->data;
    sVar6 = kernel_tm2->elemsize;
    sVar7 = kernel_tm2->cstep;
    uVar28 = uVar21;
    do {
      lVar16 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      puVar17 = (undefined4 *)(lVar16 * uVar28 + (long)local_c8.data);
      lVar15 = 0;
      do {
        if (0 < inch) {
          lVar29 = (long)pvVar30 + (long)iVar14 * sVar6 * lVar15 + (uVar28 >> 3) * sVar7 * sVar6;
          uVar21 = 0;
          puVar22 = puVar17;
          do {
            lVar26 = 0;
            puVar31 = puVar22;
            do {
              *(undefined4 *)(lVar29 + lVar26) = *puVar31;
              puVar31 = (undefined4 *)((long)puVar31 + lVar16);
              lVar26 = lVar26 + 4;
            } while (lVar26 != 0x20);
            uVar21 = uVar21 + 1;
            puVar22 = (undefined4 *)
                      ((long)puVar22 +
                      (long)local_c8.w *
                      CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
            lVar29 = lVar29 + 0x20;
          } while (uVar21 != uVar18);
        }
        lVar15 = lVar15 + 1;
        puVar17 = puVar17 + 1;
      } while (lVar15 != 0x24);
      uVar21 = uVar28 + 8;
      uVar20 = uVar28 + 0xf;
      uVar28 = uVar21;
    } while (uVar20 < uVar27);
  }
  if ((int)((uint)uVar21 | 3) < outch) {
    iVar14 = kernel_tm2->w;
    pvVar30 = kernel_tm2->data;
    sVar6 = kernel_tm2->elemsize;
    sVar7 = kernel_tm2->cstep;
    uVar21 = uVar21 & 0xffffffff;
    do {
      lVar16 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      puVar17 = (undefined4 *)(lVar16 * uVar21 + (long)local_c8.data);
      lVar15 = 0;
      do {
        if (0 < inch) {
          lVar29 = (long)pvVar30 +
                   (long)iVar14 * sVar6 * lVar15 +
                   (ulong)(((uint)(uVar21 >> 3) & 0x1fffffff) + (uint)(((uint)uVar21 >> 2 & 1) != 0)
                          ) * sVar7 * sVar6;
          uVar28 = 0;
          puVar22 = puVar17;
          do {
            lVar26 = 0;
            puVar31 = puVar22;
            do {
              *(undefined4 *)(lVar29 + lVar26) = *puVar31;
              puVar31 = (undefined4 *)((long)puVar31 + lVar16);
              lVar26 = lVar26 + 4;
            } while (lVar26 != 0x10);
            uVar28 = uVar28 + 1;
            puVar22 = (undefined4 *)
                      ((long)puVar22 +
                      (long)local_c8.w *
                      CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
            lVar29 = lVar29 + 0x10;
          } while (uVar28 != uVar18);
        }
        lVar15 = lVar15 + 1;
        puVar17 = puVar17 + 1;
      } while (lVar15 != 0x24);
      uVar21 = uVar21 + 4;
    } while ((int)((uint)uVar21 | 3) < outch);
  }
  if ((int)uVar21 < outch) {
    iVar14 = kernel_tm2->w;
    pvVar30 = kernel_tm2->data;
    sVar6 = kernel_tm2->elemsize;
    uVar28 = uVar21 & 0xffffffff;
    sVar7 = kernel_tm2->cstep;
    do {
      uVar23 = (uint)uVar21;
      pvVar19 = (void *)((ulong)((uVar23 & 3) + ((uint)(uVar21 >> 3) & 0x1fffffff) +
                                (uint)((uVar23 >> 2 & 1) != 0)) * sVar7 * sVar6 + (long)pvVar30);
      puVar17 = (undefined4 *)
                (CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * local_c8.cstep *
                 uVar28 + (long)local_c8.data);
      lVar16 = 0;
      do {
        if (0 < inch) {
          uVar21 = 0;
          puVar22 = puVar17;
          do {
            *(undefined4 *)((long)pvVar19 + uVar21 * 4) = *puVar22;
            uVar21 = uVar21 + 1;
            puVar22 = (undefined4 *)
                      ((long)puVar22 +
                      (long)local_c8.w *
                      CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
          } while (uVar18 != uVar21);
        }
        lVar16 = lVar16 + 1;
        puVar17 = puVar17 + 1;
        pvVar19 = (void *)((long)pvVar19 + (long)iVar14 * sVar6);
      } while (lVar16 != 0x24);
      uVar28 = uVar28 + 1;
      uVar21 = (ulong)(uVar23 + 1);
    } while (uVar28 != uVar27);
  }
  piVar12 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm2, int inch, int outch, const Option& opt)
{
    Mat kernel_tm(6 * 6, inch, outch);

    // G
    const float ktm[6][3] = {
        {1.0f / 4, 0.0f, 0.0f},
        {-1.0f / 6, -1.0f / 6, -1.0f / 6},
        {-1.0f / 6, 1.0f / 6, -1.0f / 6},
        {1.0f / 24, 1.0f / 12, 1.0f / 6},
        {1.0f / 24, -1.0f / 12, 1.0f / 6},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = inch-36-outch
#if __SSE2__
    kernel_tm2.create(8 * inch, 36, outch / 8 + (outch % 8) / 4 + outch % 4);
#else
    kernel_tm2.create(inch, 36, outch);
#endif

    int q = 0;
#if __SSE2__
    for (; q + 7 < outch; q += 8)
    {
        Mat g0 = kernel_tm2.channel(q / 8);

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 8; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4);

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
#endif
    for (; q < outch; q++)
    {
#if __SSE2__
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4 + q % 4);
#else
        Mat g0 = kernel_tm2.channel(q);
#endif

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                const float* k00 = kernel_tm.channel(q).row(p);
                g00[0] = k00[k];
                g00++;
            }
        }
    }
}